

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O1

void __thiscall Potassco::SmodelsConvert::flushSymbols(SmodelsConvert *this)

{
  pointer pSVar1;
  AbstractProgram *pAVar2;
  char *__s;
  long lVar3;
  ulong uVar4;
  pointer pSVar5;
  Lit_t x;
  uint local_54;
  uint *local_50;
  undefined8 local_48;
  char *local_40;
  size_t local_38;
  
  pSVar5 = (this->data_->output_).
           super__Vector_base<Potassco::SmodelsConvert::SmData::Symbol,_std::allocator<Potassco::SmodelsConvert::SmData::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (this->data_->output_).
           super__Vector_base<Potassco::SmodelsConvert::SmData::Symbol,_std::allocator<Potassco::SmodelsConvert::SmData::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar5 != pSVar1) {
    uVar4 = (long)pSVar1 - (long)pSVar5 >> 4;
    lVar3 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Potassco::SmodelsConvert::SmData::Symbol*,std::vector<Potassco::SmodelsConvert::SmData::Symbol,std::allocator<Potassco::SmodelsConvert::SmData::Symbol>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pSVar5,pSVar1,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<Potassco::SmodelsConvert::SmData::Symbol*,std::vector<Potassco::SmodelsConvert::SmData::Symbol,std::allocator<Potassco::SmodelsConvert::SmData::Symbol>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pSVar5,pSVar1);
  }
  pSVar5 = (this->data_->output_).
           super__Vector_base<Potassco::SmodelsConvert::SmData::Symbol,_std::allocator<Potassco::SmodelsConvert::SmData::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (this->data_->output_).
           super__Vector_base<Potassco::SmodelsConvert::SmData::Symbol,_std::allocator<Potassco::SmodelsConvert::SmData::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar5 != pSVar1) {
    do {
      local_54 = *(uint *)pSVar5 & 0x7fffffff;
      pAVar2 = this->out_;
      __s = pSVar5->name;
      local_38 = strlen(__s);
      local_50 = &local_54;
      local_48 = 1;
      local_40 = __s;
      (*pAVar2->_vptr_AbstractProgram[8])(pAVar2,&local_40,&local_50);
      pSVar5 = pSVar5 + 1;
    } while (pSVar5 != pSVar1);
  }
  return;
}

Assistant:

void SmodelsConvert::flushSymbols() {
	std::sort(data_->output_.begin(), data_->output_.end());
	for (SmData::OutVec::const_iterator it = data_->output_.begin(), end = data_->output_.end(); it != end; ++it) {
		Lit_t x = static_cast<Lit_t>(it->atom);
		out_.output(toSpan(it->name, std::strlen(it->name)), toSpan(&x, 1));
	}
}